

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O2

bool xemmai::t_type_of<double>::t_cast<double>::f_is(t_object *a_object)

{
  byte bVar1;
  
  if (a_object < (t_object *)0x5) {
    bVar1 = 0x18 >> ((byte)a_object & 0x1f);
  }
  else if (a_object->v_type->v_depth == 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = (undefined8 *)a_object->v_type->v_ids[1] == &v__type_id<double>;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool f_is(t_object* a_object)
		{
			if (!std::is_same_v<typename t_fundamental<T>::t_type, double>) return reinterpret_cast<uintptr_t>(a_object) >= c_tag__OBJECT && a_object->f_type()->f_derives<typename t_fundamental<T>::t_type>();
			switch (reinterpret_cast<uintptr_t>(a_object)) {
			case c_tag__NULL:
			case c_tag__FALSE:
			case c_tag__TRUE:
				return false;
			case c_tag__INTEGER:
			case c_tag__FLOAT:
				return true;
			default:
				return a_object->f_type()->f_derives<double>();
			}
		}